

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_snap_prev(ASMState *as)

{
  jit_State *J;
  long in_RDI;
  ptrdiff_t ofs;
  TraceError in_stack_ffffffffffffffec;
  
  if (*(uint *)(in_RDI + 200) < *(uint *)(in_RDI + 0xd4)) {
    J = (jit_State *)(*(long *)(in_RDI + 0x130) - *(long *)(in_RDI + 0x80));
    if (0xffff < (long)J) {
      lj_trace_err(J,in_stack_ffffffffffffffec);
    }
    do {
      if (*(int *)(in_RDI + 0xdc) == 0) {
        return;
      }
      *(int *)(in_RDI + 0xdc) = *(int *)(in_RDI + 0xdc) + -1;
      *(uint *)(in_RDI + 0xd4) =
           (uint)*(ushort *)
                  (*(long *)(*(long *)(in_RDI + 0x110) + 0x20) +
                   (ulong)*(uint *)(in_RDI + 0xdc) * 0xc + 4);
      *(short *)(*(long *)(*(long *)(in_RDI + 0x110) + 0x20) + (ulong)*(uint *)(in_RDI + 0xdc) * 0xc
                + 6) = (short)J;
    } while (*(uint *)(in_RDI + 200) < *(uint *)(in_RDI + 0xd4));
    *(undefined4 *)(in_RDI + 0xf8) = 1;
  }
  return;
}

Assistant:

static void asm_snap_prev(ASMState *as)
{
  if (as->curins < as->snapref) {
    ptrdiff_t ofs = as->mctoporig - as->mcp;
    if (ofs >= 0x10000) lj_trace_err(as->J, LJ_TRERR_MCODEOV);
    do {
      if (as->snapno == 0) return;
      as->snapno--;
      as->snapref = as->T->snap[as->snapno].ref;
      as->T->snap[as->snapno].mcofs = ofs;  /* Remember mcode offset. */
    } while (as->curins < as->snapref);  /* May have no ins inbetween. */
    as->snapalloc = 1;
  }
}